

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O2

SDVertex * __thiscall pbrt::SDFace::otherVert(SDFace *this,SDVertex *v0,SDVertex *v1)

{
  SDVertex *pSVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 3) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/loopsubdiv.cpp"
               ,0x44,"Basic logic error in SDVertex::otherVert()");
    }
    pSVar1 = this->v[lVar2];
    lVar2 = lVar2 + 1;
  } while (pSVar1 == v1 || pSVar1 == v0);
  return pSVar1;
}

Assistant:

SDVertex *otherVert(SDVertex *v0, SDVertex *v1) {
        for (int i = 0; i < 3; ++i)
            if (v[i] != v0 && v[i] != v1)
                return v[i];
        LOG_FATAL("Basic logic error in SDVertex::otherVert()");
        return nullptr;
    }